

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::complex<double>,_1000>::TPZManVector
          (TPZManVector<std::complex<double>,_1000> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  complex<double> *pcVar3;
  ulong in_RSI;
  undefined8 *in_RDI;
  complex<double> *local_60;
  TPZVec<std::complex<double>_> *in_stack_ffffffffffffffd0;
  complex<double> *local_28;
  
  TPZVec<std::complex<double>_>::TPZVec(in_stack_ffffffffffffffd0,(int64_t)in_RDI);
  *in_RDI = &PTR__TPZManVector_02564aa0;
  local_28 = (complex<double> *)(in_RDI + 4);
  pcVar3 = (complex<double> *)(in_RDI + 0x7d4);
  do {
    std::complex<double>::complex(local_28,0.0,0.0);
    local_28 = local_28 + 1;
  } while (local_28 != pcVar3);
  if ((long)in_RSI < 0x3e9) {
    in_RDI[1] = in_RDI + 4;
    in_RDI[2] = in_RSI;
    in_RDI[3] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pcVar3 = (complex<double> *)operator_new__(uVar2);
    if (in_RSI != 0) {
      local_60 = pcVar3;
      do {
        std::complex<double>::complex(local_60,0.0,0.0);
        local_60 = local_60 + 1;
      } while (local_60 != pcVar3 + in_RSI);
    }
    in_RDI[1] = pcVar3;
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}